

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_List.h
# Opt level: O0

void __thiscall
axl::sl::
OwningListBase<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>,_axl::sl::ImplicitPtrCast<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>,_axl::sl::ListLink>,_axl::sl::BoxIterator<axl::rc::Ptr<void>_>,_axl::sl::ConstBoxIterator<axl::rc::Ptr<void>_>,_axl::mem::Delete<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_>_>
::clear(OwningListBase<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>,_axl::sl::ImplicitPtrCast<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>,_axl::sl::ListLink>,_axl::sl::BoxIterator<axl::rc::Ptr<void>_>,_axl::sl::ConstBoxIterator<axl::rc::Ptr<void>_>,_axl::mem::Delete<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_>_>
        *this)

{
  Delete<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_> *in_RDI;
  BoxListEntry<axl::rc::Ptr<void>_> *p;
  ListLink *link;
  BoxListEntry<axl::rc::Ptr<void>_> *in_stack_ffffffffffffffc8;
  Entry *in_stack_ffffffffffffffe0;
  ImplicitPtrCast<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>,_axl::sl::ListLink> local_11;
  ListLink *local_10;
  
  if (*(long *)in_RDI != 0) {
    local_10 = ImplicitPtrCast<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>,_axl::sl::ListLink>::
               operator()(&local_11,*(BoxListEntry<axl::rc::Ptr<void>_> **)in_RDI);
    while (local_10 != (ListLink *)0x0) {
      in_stack_ffffffffffffffe0 =
           IteratorBase<axl::sl::BoxIterator<axl::rc::Ptr<void>_>,_axl::sl::BoxListEntry<axl::rc::Ptr<void>_>,_axl::sl::ListLink,_axl::sl::ImplicitCast<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_*,_axl::sl::ListLink_*>_>
           ::getEntryFromLink(&in_stack_ffffffffffffffe0->super_ListLink);
      local_10 = ListLink::getNext(local_10);
      mem::Delete<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_>::operator()
                (in_RDI,in_stack_ffffffffffffffc8);
    }
    ListBase<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>,_axl::sl::ImplicitPtrCast<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>,_axl::sl::ListLink>,_axl::sl::BoxIterator<axl::rc::Ptr<void>_>,_axl::sl::ConstBoxIterator<axl::rc::Ptr<void>_>_>
    ::construct((ListBase<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>,_axl::sl::ImplicitPtrCast<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>,_axl::sl::ListLink>,_axl::sl::BoxIterator<axl::rc::Ptr<void>_>,_axl::sl::ConstBoxIterator<axl::rc::Ptr<void>_>_>
                 *)in_RDI);
  }
  return;
}

Assistant:

void
	clear() {
		if (!this->m_head)
			return;

		ListLink* link = GetLink()(this->m_head);
		while (link) {
			T* p = Iterator::getEntryFromLink(link);
			link = link->getNext();
			Delete()(p);
		}

		this->construct();
	}